

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ChromeCompositorStateMachine_MajorState::
~ChromeCompositorStateMachine_MajorState(ChromeCompositorStateMachine_MajorState *this)

{
  ChromeCompositorStateMachine_MajorState *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ChromeCompositorStateMachine_MajorState_009c1d18;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

ChromeCompositorStateMachine_MajorState::~ChromeCompositorStateMachine_MajorState() = default;